

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void move_right(int *angle,int *thrust,int vdistance,int dhs)

{
  int *piVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  int local_30 [3];
  int local_24;
  int local_20;
  int desired;
  int dhs_local;
  int vdistance_local;
  int *thrust_local;
  int *angle_local;
  
  iVar4 = R;
  local_24 = -0x16;
  if (dhs < HS) {
    local_24 = 0;
  }
  local_30[2] = local_24 - R;
  local_30[1] = 0xf;
  local_20 = dhs;
  desired = vdistance;
  _dhs_local = thrust;
  thrust_local = angle;
  piVar1 = std::min<int>(local_30 + 2,local_30 + 1);
  local_30[0] = -0xf;
  piVar1 = std::max<int>(piVar1,local_30);
  *thrust_local = iVar4 + *piVar1;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_24);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,R);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*thrust_local);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (local_24 == 0) {
    iVar4 = 0;
    if (500 < desired) {
      iVar4 = -0x14;
    }
    iVar3 = 2;
    if (VS < iVar4) {
      iVar3 = 4;
    }
    *_dhs_local = iVar3;
  }
  else {
    *_dhs_local = 4;
  }
  return;
}

Assistant:

void move_right(int& angle, int& thrust, int vdistance, int dhs = 30)
{
    int desired = dhs < HS ? 0 : -TrueAngle;
    angle = R + std::max(std::min(desired - R, 15), -15);
    std::cerr << desired << "/" << R << "/" << angle << std::endl;
    if (0 != desired)
    {
        thrust = 4;
    }
    else
    {
        thrust = (500 < vdistance ? -20 : 0) > VS ? 4 : 2;
    }
}